

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O3

MXFWriter * __thiscall
AS_02::PCM::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,FileDescriptor *essence_descriptor,
          InterchangeObject_list_t *essence_sub_descriptor_list,Rational *edit_rate,
          ui32_t header_size)

{
  undefined2 uVar1;
  ILogSink *pIVar2;
  h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR> *this_00;
  Dictionary *d;
  long lVar3;
  undefined1 *puVar4;
  FileDescriptor *pFVar5;
  WriterInfo *pWVar6;
  byte bVar7;
  
  bVar7 = 0;
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar2,"Essence descriptor object required.\n");
    puVar4 = Kumu::RESULT_PARAM;
  }
  else {
    if (essence_descriptor[0x40] != (FileDescriptor)0x1) {
      this_00 = (h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR> *)operator_new(0x5e0);
      d = (Dictionary *)ASDCP::DefaultSMPTEDict();
      h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>::h__AS02Writer(this_00,d);
      this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter =
           (_func_int **)0x0;
      this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_Dict = (Dictionary *)0x0;
      *(undefined4 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_File = 1;
      (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>)._vptr_TrackFileWriter =
           (_func_int **)&PTR__h__AS02Writer_0016b638;
      *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.field_0x18 = 0;
      *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.field_0x20 = 0;
      *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.field_0x24 = 0;
      *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.field_0x2c = 0;
      if ((long *)filename->_M_string_length != (long *)0x0) {
        (**(code **)(*(long *)filename->_M_string_length + 8))();
      }
      filename->_M_string_length = (size_type)this_00;
      pFVar5 = essence_descriptor;
      pWVar6 = &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info;
      for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)pWVar6->ProductUUID = *(undefined8 *)pFVar5;
        pFVar5 = pFVar5 + (ulong)bVar7 * -0x10 + 8;
        pWVar6 = (WriterInfo *)((long)pWVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      uVar1 = *(undefined2 *)(essence_descriptor + 0x40);
      (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.EncryptedEssence =
           (bool)(char)uVar1;
      (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.UsesHMAC =
           (bool)(char)((ushort)uVar1 >> 8);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.ProductVersion);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.CompanyName);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.ProductName);
      (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.LabelSetType =
           *(LabelSet_t *)(essence_descriptor + 0xa8);
      h__Writer::OpenWrite
                ((h__Writer *)this,(string *)filename->_M_string_length,(FileDescriptor *)Info,
                 essence_sub_descriptor_list,(ui32_t *)edit_rate);
      if (-1 < *(int *)&this->_vptr_MXFWriter) {
        h__Writer::SetSourceStream
                  ((h__Writer *)&stack0xffffffffffffff68,(Rational *)filename->_M_string_length);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        if (-1 < *(int *)&this->_vptr_MXFWriter) {
          return this;
        }
      }
      filename->_M_string_length = 0;
      return this;
    }
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar2,"Encryption not supported for ST 382 clip-wrap.\n");
    puVar4 = Kumu::RESULT_NOTIMPL;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar4);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::OpenWrite(const std::string& filename, const WriterInfo& Info,
				 ASDCP::MXF::FileDescriptor* essence_descriptor,
				 ASDCP::MXF::InterchangeObject_list_t& essence_sub_descriptor_list,
				 const ASDCP::Rational& edit_rate, ui32_t header_size)
{
  if ( essence_descriptor == 0 )
    {
      DefaultLogSink().Error("Essence descriptor object required.\n");
      return RESULT_PARAM;
    }

  if ( Info.EncryptedEssence )
    {
      DefaultLogSink().Error("Encryption not supported for ST 382 clip-wrap.\n");
      return Kumu::RESULT_NOTIMPL;
    }

  m_Writer = new h__Writer(&DefaultSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, essence_descriptor, essence_sub_descriptor_list, header_size);

  if ( KM_SUCCESS(result) )
    result = m_Writer->SetSourceStream(edit_rate);

  if ( ASDCP_FAILURE(result) )
    m_Writer.release();

  return result;
}